

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rabuilders_p.h
# Opt level: O1

Error __thiscall
asmjit::v1_14::RACFGBuilderT<asmjit::v1_14::x86::RACFGBuilder>::handleBlockWithUnknownJump
          (RACFGBuilderT<asmjit::v1_14::x86::RACFGBuilder> *this,RABlock *block)

{
  StringTmp<512UL> *this_00;
  uint uVar1;
  BaseRAPass *pBVar2;
  Error EVar3;
  char *in_RCX;
  uint extraout_EDX;
  undefined1 *puVar4;
  ulong uVar5;
  RABlock *successor;
  RACFGBuilderT<asmjit::v1_14::x86::RACFGBuilder> *pRVar6;
  RABlock *pRVar7;
  
  pBVar2 = this->_pass;
  uVar1 = *(uint *)&pBVar2->field_0xb8;
  if (((byte)block[0xd] & 2) == 0) {
    pRVar7 = (RABlock *)0x0;
  }
  else {
    if (*(int *)(block + 0x70) == 0) {
LAB_0014d19a:
      handleBlockWithUnknownJump();
      this_00 = &this->_sb;
      String::clear((String *)this_00);
      String::_opChars((String *)this_00,kAppend,' ',(ulong)extraout_EDX);
      if (in_RCX != (char *)0x0) {
        String::_opString((String *)this_00,kAppend,in_RCX,0xffffffffffffffff);
        String::_opChar((String *)this_00,kAppend,' ');
      }
      Formatter::formatNode
                ((String *)this_00,&this->_formatOptions,&this->_cc->super_BaseBuilder,
                 (BaseNode *)block);
      String::_opChar((String *)this_00,kAppend,'\n');
      uVar5 = (ulong)(byte)this->_sb;
      if (uVar5 < 0x1f) {
        puVar4 = &this->field_0x69;
      }
      else {
        uVar5 = *(ulong *)&this->field_0x70;
        puVar4 = *(undefined1 **)&this->field_0x80;
      }
      EVar3 = (*this->_logger->_vptr_Logger[2])(this->_logger,puVar4,uVar5);
      return EVar3;
    }
    pRVar7 = (RABlock *)**(undefined8 **)(block + 0x68);
  }
  if (1 < uVar1) {
    uVar5 = 1;
    successor = block;
    pRVar6 = this;
    do {
      if (*(uint *)&pBVar2->field_0xb8 <= uVar5) {
        handleBlockWithUnknownJump();
        block = successor;
        this = pRVar6;
        goto LAB_0014d19a;
      }
      successor = *(RABlock **)(*(long *)&pBVar2->_blocks + uVar5 * 8);
      if ((successor != pRVar7) && (((byte)successor[0xc] & 4) != 0)) {
        pRVar6 = (RACFGBuilderT<asmjit::v1_14::x86::RACFGBuilder> *)block;
        RABlock::appendSuccessor(block,successor);
      }
      uVar5 = uVar5 + 1;
    } while (uVar1 != uVar5);
  }
  EVar3 = shareAssignmentAcrossSuccessors(this,block);
  return EVar3;
}

Assistant:

Error handleBlockWithUnknownJump(RABlock* block) noexcept {
    RABlocks& blocks = _pass->blocks();
    size_t blockCount = blocks.size();

    // NOTE: Iterate from `1` as the first block is the entry block, we don't
    // allow the entry to be a successor of any block.
    RABlock* consecutive = block->consecutive();
    for (size_t i = 1; i < blockCount; i++) {
      RABlock* candidate = blocks[i];
      if (candidate == consecutive || !candidate->isTargetable())
        continue;
      block->appendSuccessor(candidate);
    }

    return shareAssignmentAcrossSuccessors(block);
  }